

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderNaive.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::ssc::SscReaderNaive::SscReaderNaive
          (SscReaderNaive *this,IO *io,string *name,Mode mode,MPI_Comm comm)

{
  SscReaderBase::SscReaderBase(&this->super_SscReaderBase,io,name,mode,comm);
  (this->super_SscReaderBase)._vptr_SscReaderBase = (_func_int **)&PTR__SscReaderNaive_00166ae0;
  (this->m_BlockMap)._M_h._M_buckets = &(this->m_BlockMap)._M_h._M_single_bucket;
  (this->m_BlockMap)._M_h._M_bucket_count = 1;
  (this->m_BlockMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_BlockMap)._M_h._M_element_count = 0;
  (this->m_BlockMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_BlockMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_BlockMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

SscReaderNaive::SscReaderNaive(IO &io, const std::string &name, const Mode mode, MPI_Comm comm)
: SscReaderBase(io, name, mode, comm)
{
}